

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void config_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  char *__format;
  ulong uVar3;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_kvs_config local_2a0;
  timeval __test_begin;
  fdb_file_info finfo;
  fdb_config fconfig;
  char fname [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  sVar2 = fdb_get_buffer_cache_used();
  if (sVar2 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x18a);
    config_test()::__test_pass = 1;
    __assert_fail("bcache_space_used == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x18a,"void config_test()");
  }
  fdb_get_default_config();
  memcpy(&fconfig,fname,0xf8);
  fconfig.buffercache_size = 0xffffffffffffffff;
  fVar1 = fdb_open(&dbfile,"./dummy1",&fconfig);
  if (fVar1 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,399);
    config_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_TOO_BIG_BUFFER_CACHE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,399,"void config_test()");
  }
  fdb_get_default_config();
  memcpy(&fconfig,fname,0xf8);
  fconfig.max_writer_lock_prob = 0x78;
  fVar1 = fdb_open(&dbfile,"./dummy1",&fconfig);
  if (fVar1 != FDB_RESULT_INVALID_CONFIG) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x194);
    config_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_INVALID_CONFIG",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x194,"void config_test()");
  }
  fdb_get_default_config();
  memcpy(&fconfig,fname,0xf8);
  fdb_get_default_kvs_config();
  uVar3 = 4;
  while( true ) {
    if ((int)uVar3 == 0) {
      fVar1 = fdb_open(&dbfile,fname,&fconfig);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1af);
        config_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1af,"void config_test()");
      }
      fVar1 = fdb_kvs_open(dbfile,&db,"justonekv",&local_2a0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1b1);
        config_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1b1,"void config_test()");
      }
      fVar1 = fdb_set_kv(db,"key",3,"body",5);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1b3);
        config_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1b3,"void config_test()");
      }
      sVar2 = fdb_get_buffer_cache_used();
      if (sVar2 != fconfig.blocksize << 3) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1b9);
        config_test()::__test_pass = '\x01';
        if (sVar2 != fconfig.blocksize << 3) {
          __assert_fail("bcache_space_used == fconfig.blocksize * 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x1b9,"void config_test()");
        }
      }
      fdb_close(dbfile);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"forestdb config test");
      return;
    }
    sprintf(fname,"dummy%d",uVar3);
    fVar1 = fdb_open(&dbfile,fname,&fconfig);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x19b);
      config_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x19b,"void config_test()");
    }
    fVar1 = fdb_kvs_open(dbfile,&db,"justonekv",&local_2a0);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    sVar2 = fdb_get_buffer_cache_used();
    fVar1 = fdb_get_file_info(dbfile,&finfo);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1a3);
      config_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1a3,"void config_test()");
    }
    if (finfo.file_size != fconfig.blocksize * 7) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1a6);
      config_test()::__test_pass = '\x01';
      if (finfo.file_size != fconfig.blocksize * 7) {
        __assert_fail("finfo.file_size == fconfig.blocksize * 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1a6,"void config_test()");
      }
    }
    if (sVar2 != fconfig.blocksize * 2) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1a8);
      config_test()::__test_pass = '\x01';
      if (sVar2 != fconfig.blocksize * 2) {
        __assert_fail("bcache_space_used == fconfig.blocksize * 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1a8,"void config_test()");
      }
    }
    fVar1 = fdb_close(dbfile);
    uVar3 = (ulong)((int)uVar3 - 1);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1ab);
      config_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1ab,"void config_test()");
    }
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x19d);
  config_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x19d,"void config_test()");
}

Assistant:

void config_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    int nfiles = 4;
    int i;
    size_t bcache_space_used;
    char fname[256];

    // remove previous dummy test files
    int r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    bcache_space_used = fdb_get_buffer_cache_used();
    TEST_CHK(bcache_space_used == 0);

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size= (uint64_t) -1;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_TOO_BIG_BUFFER_CACHE);

    fconfig = fdb_get_default_config();
    fconfig.max_writer_lock_prob = 120;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    for (i = nfiles; i; --i) {
        sprintf(fname, "dummy%d", i);
        status = fdb_open(&dbfile, fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        bcache_space_used = fdb_get_buffer_cache_used();

        fdb_file_info finfo;
        status = fdb_get_file_info(dbfile, &finfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Since V3 magic number, 7 blocks are used:
        // 4 superblocks + KV name header + Stale-tree root node + DB header
        TEST_CHK(finfo.file_size == fconfig.blocksize * 7);
        // Buffercache must only have KV name header + stale-tree root
        TEST_CHK(bcache_space_used == fconfig.blocksize * 2);

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_open(&dbfile, fname, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(db, (void*)"key", 3, (void*)"body", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    bcache_space_used = fdb_get_buffer_cache_used();

    // Since V3 magic number, 8 blocks are used:
    // 7 blocks created eariler + document block for KV pair
    TEST_CHK(bcache_space_used == fconfig.blocksize * 8);

    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("forestdb config test");
}